

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_half_to_float_4chan_planar(exr_decode_pipeline_t *decode)

{
  int w;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  exr_coding_channel_info_t *peVar6;
  float *out;
  float *out_00;
  uint16_t *in;
  long lVar7;
  int iVar8;
  float *out_01;
  float *out_02;
  
  in = (uint16_t *)decode->unpacked_buffer;
  peVar6 = decode->channels;
  w = peVar6->width;
  lVar7 = (long)w;
  iVar1 = (decode->chunk).height;
  iVar2 = peVar6->user_line_stride;
  iVar3 = peVar6[1].user_line_stride;
  iVar4 = peVar6[2].user_line_stride;
  iVar5 = peVar6[3].user_line_stride;
  out_01 = (float *)(peVar6->field_12).decode_to_ptr;
  out = (float *)peVar6[1].field_12.decode_to_ptr;
  out_00 = (float *)peVar6[2].field_12.decode_to_ptr;
  out_02 = (float *)peVar6[3].field_12.decode_to_ptr;
  iVar8 = 0;
  if (0 < iVar1) {
    iVar8 = iVar1;
  }
  while (iVar8 != 0) {
    half_to_float_buffer(out_01,in,w);
    half_to_float_buffer(out,in + lVar7,w);
    half_to_float_buffer(out_00,in + lVar7 * 2,w);
    half_to_float_buffer(out_02,in + lVar7 * 3,w);
    out_01 = (float *)((long)out_01 + (long)iVar2);
    out = (float *)((long)out + (long)iVar3);
    out_00 = (float *)((long)out_00 + (long)iVar4);
    out_02 = (float *)((long)out_02 + (long)iVar5);
    in = in + lVar7 * 4;
    iVar8 = iVar8 + -1;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_4chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    // planar output
    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion

        half_to_float_buffer ((float*) out0, in0, w);
        half_to_float_buffer ((float*) out1, in1, w);
        half_to_float_buffer ((float*) out2, in2, w);
        half_to_float_buffer ((float*) out3, in3, w);

        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}